

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O0

ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> * __thiscall
flow::IRProgram::get<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,flow::util::Cidr>
          (IRProgram *this,
          vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
          *table,Cidr *literal)

{
  Cidr *this_00;
  bool bVar1;
  reference pvVar2;
  pointer pCVar3;
  undefined1 local_90 [88];
  size_type local_38;
  size_t e;
  size_t i;
  Cidr *literal_local;
  vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
  *table_local;
  IRProgram *this_local;
  
  e = 0;
  i = (size_t)literal;
  literal_local = (Cidr *)table;
  table_local = (vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
                 *)this;
  local_38 = std::
             vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
             ::size(table);
  while( true ) {
    this_00 = literal_local;
    if (e == local_38) {
      std::
      make_unique<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,flow::util::Cidr_const&>
                ((Cidr *)local_90);
      std::
      vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>,std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>>>
      ::
      emplace_back<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>>
                ((vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>,std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>,std::default_delete<flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>>>>
                  *)this_00,
                 (unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
                  *)local_90);
      std::
      unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
      ::~unique_ptr((unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
                     *)local_90);
      pvVar2 = std::
               vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
               ::back((vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
                       *)literal_local);
      pCVar3 = std::
               unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
               ::get(pvVar2);
      return pCVar3;
    }
    pvVar2 = std::
             vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
             ::operator[]((vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
                           *)literal_local,e);
    pCVar3 = std::
             unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
             ::operator->(pvVar2);
    ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>::get((Cidr *)(local_90 + 8),pCVar3);
    bVar1 = util::operator==((Cidr *)(local_90 + 8),(Cidr *)i);
    if (bVar1) break;
    e = e + 1;
  }
  pvVar2 = std::
           vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>_>_>
                         *)literal_local,e);
  pCVar3 = std::
           unique_ptr<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>,_std::default_delete<flow::ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>_>_>
           ::get(pvVar2);
  return pCVar3;
}

Assistant:

T* IRProgram::get(std::vector<std::unique_ptr<T>>& table, const U& literal) {
  for (size_t i = 0, e = table.size(); i != e; ++i)
    if (table[i]->get() == literal)
      return table[i].get();

  table.emplace_back(std::make_unique<T>(literal));
  return table.back().get();
}